

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

StringEntry * __thiscall
cmELFInternalImpl<cmELFTypes32>::GetDynamicSectionString
          (cmELFInternalImpl<cmELFTypes32> *this,uint tag)

{
  map<unsigned_int,_cmELF::StringEntry,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>_>
  *this_00;
  pointer paVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  ulong uVar3;
  bool bVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  long *plVar7;
  ulong uVar8;
  pointer paVar9;
  ulong uVar10;
  char *msg;
  long lVar11;
  byte bVar12;
  char c;
  uint tag_local;
  ulong local_40;
  ulong local_38;
  
  this_00 = &(this->super_cmELFInternal).DynamicSectionStrings;
  tag_local = tag;
  iVar5 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_cmELF::StringEntry>,_std::_Select1st<std::pair<const_unsigned_int,_cmELF::StringEntry>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>_>
          ::find(&this_00->_M_t,&tag_local);
  if ((_Rb_tree_header *)iVar5._M_node !=
      &(this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header) {
    if (iVar5._M_node[2]._M_parent == (_Base_ptr)0x0) {
      return (StringEntry *)0x0;
    }
    return (StringEntry *)&iVar5._M_node[1]._M_parent;
  }
  pmVar6 = std::
           map<unsigned_int,_cmELF::StringEntry,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>_>
           ::operator[](this_00,&tag_local);
  pmVar6->Position = 0;
  pmVar6->Size = 0;
  pmVar6->IndexInSection = -1;
  bVar4 = LoadDynamicSection(this);
  if (bVar4) {
    paVar1 = (this->SectionHeaders).super__Vector_base<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = (ulong)paVar1[(this->super_cmELFInternal).DynamicSectionIndex].sh_link;
    if (uVar8 < (ulong)(((long)(this->SectionHeaders).
                               super__Vector_base<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)paVar1) / 0x28)) {
      paVar9 = (this->DynamicSectionEntries).
               super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = -(long)paVar9;
      while( true ) {
        if (paVar9 == (this->DynamicSectionEntries).
                      super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          return (StringEntry *)0x0;
        }
        if (paVar9->d_tag == tag_local) break;
        paVar9 = paVar9 + 1;
        lVar11 = lVar11 + -8;
      }
      uVar10 = (ulong)(paVar9->d_un).d_val;
      local_40 = (ulong)paVar1[uVar8].sh_size;
      if ((paVar9->d_un).d_val < paVar1[uVar8].sh_size) {
        bVar12 = 0;
        std::istream::seekg((this->super_cmELFInternal).Stream._M_t.
                            super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                            ._M_head_impl,paVar1[uVar8].sh_offset + uVar10,0);
        local_38 = uVar10;
        while (((uVar3 = local_40, local_40 != uVar10 &&
                (plVar7 = (long *)std::istream::get((char *)(this->super_cmELFInternal).Stream._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                                                  ._M_head_impl), uVar3 = uVar10,
                (*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0)) &&
               (!(bool)(bVar12 & c != '\0')))) {
          if (c == '\0') {
            uVar10 = uVar10 + 1;
            bVar12 = 1;
          }
          else {
            std::__cxx11::string::push_back((char)pmVar6);
            uVar10 = uVar10 + 1;
          }
        }
        local_40 = uVar3;
        pbVar2 = (this->super_cmELFInternal).Stream._M_t.
                 super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl;
        if (((&pbVar2->field_0x20)[(long)pbVar2->_vptr_basic_istream[0xfffffffffffffffd]] & 5) != 0)
        {
          cmELFInternal::SetErrorMessage
                    (&this->super_cmELFInternal,"Dynamic section specifies unreadable RPATH.");
          std::__cxx11::string::assign((char *)pmVar6);
          return (StringEntry *)0x0;
        }
        pmVar6->Position = paVar1[uVar8].sh_offset + local_38;
        pmVar6->Size = local_40 - local_38;
        pmVar6->IndexInSection =
             (int)((ulong)-((long)&((this->DynamicSectionEntries).
                                    super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->d_tag + lVar11) >> 3)
        ;
        return pmVar6;
      }
      msg = "Section DYNAMIC references string beyond the end of its string section.";
    }
    else {
      msg = "Section DYNAMIC has invalid string table index.";
    }
    cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,msg);
  }
  return (StringEntry *)0x0;
}

Assistant:

cmELF::StringEntry const* cmELFInternalImpl<Types>::GetDynamicSectionString(
  unsigned int tag)
{
  // Short-circuit if already checked.
  auto dssi = this->DynamicSectionStrings.find(tag);
  if (dssi != this->DynamicSectionStrings.end()) {
    if (dssi->second.Position > 0) {
      return &dssi->second;
    }
    return nullptr;
  }

  // Create an entry for this tag.  Assume it is missing until found.
  StringEntry& se = this->DynamicSectionStrings[tag];
  se.Position = 0;
  se.Size = 0;
  se.IndexInSection = -1;

  // Try reading the dynamic section.
  if (!this->LoadDynamicSection()) {
    return nullptr;
  }

  // Get the string table referenced by the DYNAMIC section.
  ELF_Shdr const& sec = this->SectionHeaders[this->DynamicSectionIndex];
  if (sec.sh_link >= this->SectionHeaders.size()) {
    this->SetErrorMessage("Section DYNAMIC has invalid string table index.");
    return nullptr;
  }
  ELF_Shdr const& strtab = this->SectionHeaders[sec.sh_link];

  // Look for the requested entry.
  for (auto di = this->DynamicSectionEntries.begin();
       di != this->DynamicSectionEntries.end(); ++di) {
    ELF_Dyn& dyn = *di;
    if (static_cast<tagtype>(dyn.d_tag) == static_cast<tagtype>(tag)) {
      // We found the tag requested.
      // Make sure the position given is within the string section.
      if (dyn.d_un.d_val >= strtab.sh_size) {
        this->SetErrorMessage("Section DYNAMIC references string beyond "
                              "the end of its string section.");
        return nullptr;
      }

      // Seek to the position reported by the entry.
      unsigned long first = static_cast<unsigned long>(dyn.d_un.d_val);
      unsigned long last = first;
      unsigned long end = static_cast<unsigned long>(strtab.sh_size);
      this->Stream->seekg(strtab.sh_offset + first);

      // Read the string.  It may be followed by more than one NULL
      // terminator.  Count the total size of the region allocated to
      // the string.  This assumes that the next string in the table
      // is non-empty, but the "chrpath" tool makes the same
      // assumption.
      bool terminated = false;
      char c;
      while (last != end && this->Stream->get(c) && !(terminated && c)) {
        ++last;
        if (c) {
          se.Value += c;
        } else {
          terminated = true;
        }
      }

      // Make sure the whole value was read.
      if (!(*this->Stream)) {
        this->SetErrorMessage("Dynamic section specifies unreadable RPATH.");
        se.Value = "";
        return nullptr;
      }

      // The value has been read successfully.  Report it.
      se.Position = static_cast<unsigned long>(strtab.sh_offset + first);
      se.Size = last - first;
      se.IndexInSection =
        static_cast<int>(di - this->DynamicSectionEntries.begin());
      return &se;
    }
  }
  return nullptr;
}